

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O3

void ncnn::pack_B_tile_quantize(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk,float scale)

{
  float *pfVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int iVar6;
  size_t *psVar7;
  undefined1 (*pauVar8) [16];
  int iVar9;
  uint uVar10;
  uint uVar11;
  void *pvVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  undefined1 (*pauVar17) [64];
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  float *pfVar24;
  long lVar25;
  uint uVar26;
  ulong *puVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  float fVar91;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  float fVar89;
  float fVar90;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 in_ZMM9 [64];
  float fVar95;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  undefined1 in_ZMM10 [64];
  undefined1 in_ZMM11 [64];
  
  iVar6 = cpu_support_x86_avx512_vnni();
  if (iVar6 != 0) {
    pack_B_tile_fp32_to_int8_avx512vnni(B,BT,j,max_jj,k,max_kk,scale);
    return;
  }
  iVar6 = cpu_support_x86_avx_vnni_int8();
  if (iVar6 == 0) {
    iVar6 = cpu_support_x86_avx_vnni();
    auVar46 = _DAT_005b38f0;
    auVar30 = _DAT_005b38e0;
    if (iVar6 == 0) {
      iVar6 = B->elempack;
      psVar7 = (size_t *)&B->w;
      if (B->dims == 3) {
        psVar7 = &B->cstep;
      }
      iVar15 = (int)*psVar7;
      pauVar8 = (undefined1 (*) [16])BT->data;
      uVar16 = 0;
      lVar19 = (long)j;
      lVar14 = (long)iVar15;
      auVar28._4_4_ = in_XMM0_Db;
      auVar28._0_4_ = scale;
      auVar28._8_4_ = in_XMM0_Dc;
      auVar28._12_4_ = in_XMM0_Dd;
      if (0xf < max_jj) {
        auVar35 = vbroadcastss_avx512f(auVar28);
        lVar21 = (long)(iVar15 * 8);
        auVar36 = vpbroadcastd_avx512f();
        vpmulld_avx512f(auVar36,_DAT_005b3380);
        uVar26 = max_kk & 0xfffffffe;
        auVar36 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar37 = vpbroadcastd_avx512f(ZEXT416(0x3f000000));
        auVar32[8] = 0x81;
        auVar32._0_8_ = 0x8181818181818181;
        auVar32[9] = 0x81;
        auVar32[10] = 0x81;
        auVar32[0xb] = 0x81;
        auVar32[0xc] = 0x81;
        auVar32[0xd] = 0x81;
        auVar32[0xe] = 0x81;
        auVar32[0xf] = 0x81;
        in_ZMM6 = ZEXT1664(_DAT_005b38f0);
        uVar18 = 0;
        do {
          pvVar12 = (void *)((lVar19 + uVar18) * lVar14 * 4 + (long)B->data);
          pauVar17 = (undefined1 (*) [64])((long)pvVar12 + (long)(iVar6 * k) * 4);
          if (iVar6 == 0x10) {
            uVar10 = 0;
            if (1 < max_kk) {
              iVar9 = 1;
              do {
                auVar38 = vmulps_avx512f(auVar35,*pauVar17);
                auVar39 = vmulps_avx512f(auVar35,pauVar17[1]);
                auVar40 = vmovdqa64_avx512f(auVar37);
                auVar40 = vpternlogd_avx512f(auVar40,auVar38,auVar36,0xf8);
                auVar38 = vaddps_avx512f(auVar38,auVar40);
                auVar38 = vcvttps2dq_avx512f(auVar38);
                auVar28 = vpmovsdb_avx512f(auVar38);
                auVar28 = vpmaxsb_avx(auVar28,auVar32);
                auVar38 = vmovdqa64_avx512f(auVar37);
                auVar38 = vpternlogd_avx512f(auVar38,auVar39,auVar36,0xf8);
                auVar38 = vaddps_avx512f(auVar39,auVar38);
                auVar38 = vcvttps2dq_avx512f(auVar38);
                auVar29 = vpmovsdb_avx512f(auVar38);
                auVar29 = vpmaxsb_avx(auVar29,auVar32);
                auVar31 = vpunpcklbw_avx(auVar28,auVar29);
                in_ZMM9 = ZEXT1664(auVar31);
                auVar28 = vpunpckhbw_avx(auVar28,auVar29);
                *pauVar8 = auVar31;
                pauVar8[1] = auVar28;
                pauVar8 = pauVar8 + 2;
                pauVar17 = pauVar17 + 2;
                iVar9 = iVar9 + 2;
                uVar10 = uVar26;
              } while (iVar9 < max_kk);
            }
            pvVar12 = (void *)(ulong)(max_kk - uVar10);
            if (max_kk - uVar10 != 0 && (int)uVar10 <= max_kk) {
              do {
                auVar38 = vmulps_avx512f(auVar35,*pauVar17);
                auVar39 = vmovdqa64_avx512f(auVar37);
                auVar39 = vpternlogd_avx512f(auVar39,auVar38,auVar36,0xf8);
                auVar38 = vaddps_avx512f(auVar38,auVar39);
                auVar38 = vcvttps2dq_avx512f(auVar38);
                auVar28 = vpmovsdb_avx512f(auVar38);
                auVar28 = vpmaxsb_avx(auVar28,auVar32);
                *pauVar8 = auVar28;
                pauVar8 = pauVar8 + 1;
                pauVar17 = pauVar17 + 1;
                uVar10 = (int)pvVar12 - 1;
                pvVar12 = (void *)(ulong)uVar10;
              } while (uVar10 != 0);
            }
          }
          if (iVar6 == 8) {
            uVar10 = 0;
            if (1 < max_kk) {
              iVar9 = 1;
              do {
                auVar38 = vmulps_avx512f(auVar35,*pauVar17);
                auVar39 = vmulps_avx512f(auVar35,*(undefined1 (*) [64])(*pauVar17 + lVar21 * 4));
                auVar40 = vmovdqa64_avx512f(auVar37);
                auVar40 = vpternlogd_avx512f(auVar40,auVar38,auVar36,0xf8);
                auVar38 = vaddps_avx512f(auVar38,auVar40);
                auVar38 = vcvttps2dq_avx512f(auVar38);
                auVar28 = vpmovsdb_avx512f(auVar38);
                auVar38 = vmovdqa64_avx512f(auVar37);
                in_ZMM9 = vpternlogd_avx512f(auVar38,auVar39,auVar36,0xf8);
                auVar38 = vaddps_avx512f(auVar39,in_ZMM9);
                auVar38 = vcvttps2dq_avx512f(auVar38);
                auVar29 = vpmovsdb_avx512f(auVar38);
                auVar28 = vpshufb_avx(auVar28,auVar30);
                auVar28 = vpmaxsb_avx(auVar28,auVar32);
                auVar29 = vpshufb_avx(auVar29,auVar30);
                auVar29 = vpmaxsb_avx(auVar29,auVar32);
                *pauVar8 = auVar28;
                pauVar8[1] = auVar29;
                pauVar8 = pauVar8 + 2;
                pauVar17 = pauVar17 + 1;
                iVar9 = iVar9 + 2;
                uVar10 = uVar26;
              } while (iVar9 < max_kk);
            }
            pvVar12 = (void *)(ulong)(max_kk - uVar10);
            if (max_kk - uVar10 != 0 && (int)uVar10 <= max_kk) {
              do {
                auVar38 = vinsertf64x4_avx512f
                                    (ZEXT3264(*(undefined1 (*) [32])*pauVar17),
                                     *(undefined1 (*) [32])(*pauVar17 + lVar21 * 4),1);
                auVar38 = vmulps_avx512f(auVar38,auVar35);
                auVar39 = vmovdqa64_avx512f(auVar37);
                auVar39 = vpternlogd_avx512f(auVar39,auVar38,auVar36,0xf8);
                auVar38 = vaddps_avx512f(auVar38,auVar39);
                auVar38 = vcvttps2dq_avx512f(auVar38);
                auVar28 = vpmovsdb_avx512f(auVar38);
                auVar28 = vpmaxsb_avx(auVar28,auVar32);
                *pauVar8 = auVar28;
                pauVar8 = pauVar8 + 1;
                pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x20);
                uVar10 = (int)pvVar12 - 1;
                pvVar12 = (void *)(ulong)uVar10;
              } while (uVar10 != 0);
            }
          }
          if (iVar6 == 4) {
            pvVar12 = (void *)0x0;
            if (1 < max_kk) {
              iVar9 = 1;
              do {
                auVar38 = vinsertf64x4_avx512f
                                    (ZEXT3264(*(undefined1 (*) [32])*pauVar17),
                                     *(undefined1 (*) [32])(*pauVar17 + (long)(iVar15 * 4) * 4),1);
                auVar39 = vinsertf64x4_avx512f
                                    (ZEXT3264(*(undefined1 (*) [32])(*pauVar17 + lVar21 * 4)),
                                     *(undefined1 (*) [32])(*pauVar17 + (long)(iVar15 * 0xc) * 4),1)
                ;
                auVar38 = vmulps_avx512f(auVar38,auVar35);
                auVar39 = vmulps_avx512f(auVar39,auVar35);
                auVar40 = vmovdqa64_avx512f(auVar37);
                auVar40 = vpternlogd_avx512f(auVar40,auVar38,auVar36,0xf8);
                auVar38 = vaddps_avx512f(auVar38,auVar40);
                auVar38 = vcvttps2dq_avx512f(auVar38);
                auVar28 = vpmovsdb_avx512f(auVar38);
                auVar38 = vmovdqa64_avx512f(auVar37);
                in_ZMM9 = vpternlogd_avx512f(auVar38,auVar39,auVar36,0xf8);
                auVar38 = vaddps_avx512f(auVar39,in_ZMM9);
                auVar38 = vcvttps2dq_avx512f(auVar38);
                auVar29 = vpmovsdb_avx512f(auVar38);
                auVar28 = vpshufb_avx(auVar28,auVar46);
                auVar28 = vpmaxsb_avx(auVar28,auVar32);
                auVar29 = vpshufb_avx(auVar29,auVar46);
                auVar29 = vpmaxsb_avx(auVar29,auVar32);
                *pauVar8 = auVar28;
                pauVar8[1] = auVar29;
                pauVar8 = pauVar8 + 2;
                pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x20);
                iVar9 = iVar9 + 2;
              } while (iVar9 < max_kk);
              pvVar12 = (void *)(ulong)uVar26;
            }
            iVar9 = max_kk - (int)pvVar12;
            if (iVar9 != 0 && (int)pvVar12 <= max_kk) {
              do {
                auVar33._16_16_ = *(undefined1 (*) [16])(*pauVar17 + (long)(iVar15 * 0xc) * 4);
                auVar33._0_16_ = *(undefined1 (*) [16])(*pauVar17 + lVar21 * 4);
                auVar38 = vinsertf64x4_avx512f
                                    (ZEXT3264(CONCAT1616(*(undefined1 (*) [16])
                                                          (*pauVar17 + (long)(iVar15 * 4) * 4),
                                                         *(undefined1 (*) [16])*pauVar17)),auVar33,1
                                    );
                auVar38 = vmulps_avx512f(auVar38,auVar35);
                auVar39 = vmovdqa64_avx512f(auVar37);
                auVar39 = vpternlogd_avx512f(auVar39,auVar38,auVar36,0xf8);
                auVar38 = vaddps_avx512f(auVar38,auVar39);
                auVar38 = vcvttps2dq_avx512f(auVar38);
                auVar28 = vpmovsdb_avx512f(auVar38);
                auVar28 = vpmaxsb_avx(auVar28,auVar32);
                *pauVar8 = auVar28;
                pauVar8 = pauVar8 + 1;
                pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x10);
                iVar9 = iVar9 + -1;
              } while (iVar9 != 0);
            }
          }
          if (iVar6 == 1) {
            uVar10 = 0;
            if (1 < max_kk) {
              iVar9 = 1;
              do {
                auVar38 = vgatherdps_avx512f(*(undefined4 *)(*pauVar17 + (long)pvVar12 * 4));
                auVar39 = vgatherdps_avx512f(*(undefined4 *)(*pauVar17 + (long)pvVar12 * 4 + 4));
                auVar38 = vmulps_avx512f(auVar38,auVar35);
                auVar39 = vmulps_avx512f(auVar39,auVar35);
                auVar40 = vmovdqa64_avx512f(auVar37);
                auVar40 = vpternlogd_avx512f(auVar40,auVar38,auVar36,0xf8);
                auVar38 = vaddps_avx512f(auVar38,auVar40);
                auVar38 = vcvttps2dq_avx512f(auVar38);
                auVar28 = vpmovsdb_avx512f(auVar38);
                auVar28 = vpmaxsb_avx(auVar28,auVar32);
                auVar38 = vmovdqa64_avx512f(auVar37);
                auVar38 = vpternlogd_avx512f(auVar38,auVar39,auVar36,0xf8);
                auVar38 = vaddps_avx512f(auVar39,auVar38);
                auVar38 = vcvttps2dq_avx512f(auVar38);
                auVar29 = vpmovsdb_avx512f(auVar38);
                auVar29 = vpmaxsb_avx(auVar29,auVar32);
                auVar31 = vpunpcklbw_avx(auVar28,auVar29);
                in_ZMM9 = ZEXT1664(auVar31);
                auVar28 = vpunpckhbw_avx(auVar28,auVar29);
                *pauVar8 = auVar31;
                pauVar8[1] = auVar28;
                pauVar8 = pauVar8 + 2;
                pauVar17 = (undefined1 (*) [64])(*pauVar17 + 8);
                iVar9 = iVar9 + 2;
                uVar10 = uVar26;
              } while (iVar9 < max_kk);
            }
            uVar11 = max_kk - uVar10;
            if (uVar11 != 0 && (int)uVar10 <= max_kk) {
              do {
                auVar38 = vgatherdps_avx512f(*(undefined4 *)(*pauVar17 + (ulong)uVar11 * 4));
                auVar38 = vmulps_avx512f(auVar38,auVar35);
                auVar39 = vmovdqa64_avx512f(auVar37);
                auVar39 = vpternlogd_avx512f(auVar39,auVar38,auVar36,0xf8);
                auVar38 = vaddps_avx512f(auVar38,auVar39);
                auVar38 = vcvttps2dq_avx512f(auVar38);
                auVar28 = vpmovsdb_avx512f(auVar38);
                auVar28 = vpmaxsb_avx(auVar28,auVar32);
                *pauVar8 = auVar28;
                pauVar8 = pauVar8 + 1;
                pauVar17 = (undefined1 (*) [64])(*pauVar17 + 4);
                uVar11 = uVar11 - 1;
              } while (uVar11 != 0);
            }
          }
          uVar16 = uVar18 + 0x10;
          uVar20 = uVar18 + 0x1f;
          uVar18 = uVar16;
        } while (uVar20 < (uint)max_jj);
      }
      auVar46 = _DAT_005b38f0;
      auVar30 = _DAT_005b38e0;
      lVar21 = (long)max_jj;
      if ((int)((uint)uVar16 | 7) < max_jj) {
        auVar33 = vpbroadcastd_avx512vl();
        vpmulld_avx2(auVar33,_DAT_005a82e0);
        lVar22 = (long)(iVar15 * 4);
        uVar26 = max_kk & 0xfffffffe;
        auVar45._8_4_ = 0x80000000;
        auVar45._0_8_ = 0x8000000080000000;
        auVar45._12_4_ = 0x80000000;
        auVar45._16_4_ = 0x80000000;
        auVar45._20_4_ = 0x80000000;
        auVar45._24_4_ = 0x80000000;
        auVar45._28_4_ = 0x80000000;
        auVar49._8_4_ = 0x3f000000;
        auVar49._0_8_ = 0x3f0000003f000000;
        auVar49._12_4_ = 0x3f000000;
        auVar49._16_4_ = 0x3f000000;
        auVar49._20_4_ = 0x3f000000;
        auVar49._24_4_ = 0x3f000000;
        auVar49._28_4_ = 0x3f000000;
        auVar53._8_2_ = 0x7f;
        auVar53._0_8_ = 0x7f007f007f007f;
        auVar53._10_2_ = 0x7f;
        auVar53._12_2_ = 0x7f;
        auVar53._14_2_ = 0x7f;
        auVar53._16_2_ = 0x7f;
        auVar53._18_2_ = 0x7f;
        auVar53._20_2_ = 0x7f;
        auVar53._22_2_ = 0x7f;
        auVar53._24_2_ = 0x7f;
        auVar53._26_2_ = 0x7f;
        auVar53._28_2_ = 0x7f;
        auVar53._30_2_ = 0x7f;
        auVar57._8_2_ = 0xff81;
        auVar57._0_8_ = 0xff81ff81ff81ff81;
        auVar57._10_2_ = 0xff81;
        auVar57._12_2_ = 0xff81;
        auVar57._14_2_ = 0xff81;
        auVar57._16_2_ = 0xff81;
        auVar57._18_2_ = 0xff81;
        auVar57._20_2_ = 0xff81;
        auVar57._22_2_ = 0xff81;
        auVar57._24_2_ = 0xff81;
        auVar57._26_2_ = 0xff81;
        auVar57._28_2_ = 0xff81;
        auVar57._30_2_ = 0xff81;
        in_ZMM6 = ZEXT1664(_DAT_005b38e0);
        auVar29[8] = 0x81;
        auVar29._0_8_ = 0x8181818181818181;
        auVar29[9] = 0x81;
        auVar29[10] = 0x81;
        auVar29[0xb] = 0x81;
        auVar29[0xc] = 0x81;
        auVar29[0xd] = 0x81;
        auVar29[0xe] = 0x81;
        auVar29[0xf] = 0x81;
        uVar18 = uVar16 & 0xffffffff;
        do {
          pfVar24 = (float *)((long)B->data + (long)(iVar6 * k) * 4 + (lVar19 + uVar18) * lVar14 * 4
                             );
          if (iVar6 == 8) {
            uVar10 = 0;
            if (1 < max_kk) {
              iVar15 = 1;
              do {
                auVar35._0_4_ = scale * *pfVar24;
                auVar35._4_4_ = scale * pfVar24[1];
                auVar35._8_4_ = scale * pfVar24[2];
                auVar35._12_4_ = scale * pfVar24[3];
                auVar35._16_4_ = scale * pfVar24[4];
                auVar35._20_4_ = scale * pfVar24[5];
                auVar35._28_36_ = in_ZMM9._28_36_;
                auVar35._24_4_ = scale * pfVar24[6];
                auVar36._0_4_ = scale * pfVar24[8];
                auVar36._4_4_ = scale * pfVar24[9];
                auVar36._8_4_ = scale * pfVar24[10];
                auVar36._12_4_ = scale * pfVar24[0xb];
                auVar36._16_4_ = scale * pfVar24[0xc];
                auVar36._20_4_ = scale * pfVar24[0xd];
                auVar36._28_36_ = in_ZMM10._28_36_;
                auVar36._24_4_ = scale * pfVar24[0xe];
                auVar33 = vpternlogd_avx512vl(auVar49,auVar35._0_32_,auVar45,0xf8);
                in_ZMM11 = ZEXT3264(auVar33);
                auVar34 = vpternlogd_avx512vl(auVar49,auVar36._0_32_,auVar45,0xf8);
                auVar86._0_4_ = (int)(auVar35._0_4_ + auVar33._0_4_);
                auVar86._4_4_ = (int)(auVar35._4_4_ + auVar33._4_4_);
                auVar86._8_4_ = (int)(auVar35._8_4_ + auVar33._8_4_);
                auVar86._12_4_ = (int)(auVar35._12_4_ + auVar33._12_4_);
                auVar86._16_4_ = (int)(auVar35._16_4_ + auVar33._16_4_);
                auVar86._20_4_ = (int)(auVar35._20_4_ + auVar33._20_4_);
                auVar86._24_4_ = (int)(auVar35._24_4_ + auVar33._24_4_);
                auVar86._28_4_ = (int)(in_ZMM9._28_4_ + auVar33._28_4_);
                auVar97._0_4_ = (int)(auVar36._0_4_ + auVar34._0_4_);
                auVar97._4_4_ = (int)(auVar36._4_4_ + auVar34._4_4_);
                auVar97._8_4_ = (int)(auVar36._8_4_ + auVar34._8_4_);
                auVar97._12_4_ = (int)(auVar36._12_4_ + auVar34._12_4_);
                auVar97._16_4_ = (int)(auVar36._16_4_ + auVar34._16_4_);
                auVar97._20_4_ = (int)(auVar36._20_4_ + auVar34._20_4_);
                auVar97._24_4_ = (int)(auVar36._24_4_ + auVar34._24_4_);
                auVar97._28_4_ = (int)(in_ZMM10._28_4_ + auVar34._28_4_);
                auVar33 = vpackssdw_avx2(auVar86,auVar97);
                auVar33 = vpermq_avx2(auVar33,0xd8);
                auVar33 = vpminsw_avx2(auVar33,auVar53);
                auVar33 = vpmaxsw_avx2(auVar33,auVar57);
                in_ZMM10 = ZEXT1664(auVar33._16_16_);
                auVar28 = vpacksswb_avx(auVar33._0_16_,auVar33._16_16_);
                auVar28 = vpshufb_avx(auVar28,auVar30);
                in_ZMM9 = ZEXT1664(auVar28);
                *pauVar8 = auVar28;
                pauVar8 = pauVar8 + 1;
                pfVar24 = pfVar24 + 0x10;
                iVar15 = iVar15 + 2;
                uVar10 = uVar26;
              } while (iVar15 < max_kk);
            }
            iVar15 = max_kk - uVar10;
            if (iVar15 != 0 && (int)uVar10 <= max_kk) {
              do {
                auVar37._0_4_ = scale * *pfVar24;
                auVar37._4_4_ = scale * pfVar24[1];
                auVar37._8_4_ = scale * pfVar24[2];
                auVar37._12_4_ = scale * pfVar24[3];
                auVar37._16_4_ = scale * pfVar24[4];
                auVar37._20_4_ = scale * pfVar24[5];
                auVar37._28_36_ = in_ZMM9._28_36_;
                auVar37._24_4_ = scale * pfVar24[6];
                auVar33 = vpternlogd_avx512vl(auVar49,auVar37._0_32_,auVar45,0xf8);
                in_ZMM10 = ZEXT3264(auVar33);
                auVar34._0_4_ = (int)(auVar37._0_4_ + auVar33._0_4_);
                auVar34._4_4_ = (int)(auVar37._4_4_ + auVar33._4_4_);
                auVar34._8_4_ = (int)(auVar37._8_4_ + auVar33._8_4_);
                auVar34._12_4_ = (int)(auVar37._12_4_ + auVar33._12_4_);
                auVar34._16_4_ = (int)(auVar37._16_4_ + auVar33._16_4_);
                auVar34._20_4_ = (int)(auVar37._20_4_ + auVar33._20_4_);
                auVar34._24_4_ = (int)(auVar37._24_4_ + auVar33._24_4_);
                auVar34._28_4_ = (int)(in_ZMM9._28_4_ + auVar33._28_4_);
                auVar28 = vpmovsdb_avx512vl(auVar34);
                auVar31._8_8_ = 0;
                auVar31._0_8_ = auVar28._0_8_;
                auVar28 = vpmaxsb_avx(auVar31,auVar29);
                in_ZMM9 = ZEXT1664(auVar28);
                *(long *)*pauVar8 = auVar28._0_8_;
                pauVar8 = (undefined1 (*) [16])(*pauVar8 + 8);
                pfVar24 = pfVar24 + 8;
                iVar15 = iVar15 + -1;
              } while (iVar15 != 0);
            }
          }
          if (iVar6 == 4) {
            uVar10 = 0;
            if (1 < max_kk) {
              iVar15 = 1;
              do {
                auVar38._0_4_ = scale * *pfVar24;
                auVar38._4_4_ = scale * pfVar24[1];
                auVar38._8_4_ = scale * pfVar24[2];
                auVar38._12_4_ = scale * pfVar24[3];
                auVar38._16_4_ = scale * pfVar24[4];
                auVar38._20_4_ = scale * pfVar24[5];
                auVar38._28_36_ = in_ZMM9._28_36_;
                auVar38._24_4_ = scale * pfVar24[6];
                pfVar1 = pfVar24 + lVar22;
                auVar39._0_4_ = scale * *pfVar1;
                auVar39._4_4_ = scale * pfVar1[1];
                auVar39._8_4_ = scale * pfVar1[2];
                auVar39._12_4_ = scale * pfVar1[3];
                auVar39._16_4_ = scale * pfVar1[4];
                auVar39._20_4_ = scale * pfVar1[5];
                auVar39._28_36_ = in_ZMM10._28_36_;
                auVar39._24_4_ = scale * pfVar1[6];
                auVar33 = vpternlogd_avx512vl(auVar49,auVar38._0_32_,auVar45,0xf8);
                in_ZMM11 = ZEXT3264(auVar33);
                auVar34 = vpternlogd_avx512vl(auVar49,auVar39._0_32_,auVar45,0xf8);
                auVar84._0_4_ = (int)(auVar38._0_4_ + auVar33._0_4_);
                auVar84._4_4_ = (int)(auVar38._4_4_ + auVar33._4_4_);
                auVar84._8_4_ = (int)(auVar38._8_4_ + auVar33._8_4_);
                auVar84._12_4_ = (int)(auVar38._12_4_ + auVar33._12_4_);
                auVar84._16_4_ = (int)(auVar38._16_4_ + auVar33._16_4_);
                auVar84._20_4_ = (int)(auVar38._20_4_ + auVar33._20_4_);
                auVar84._24_4_ = (int)(auVar38._24_4_ + auVar33._24_4_);
                auVar84._28_4_ = (int)(in_ZMM9._28_4_ + auVar33._28_4_);
                auVar96._0_4_ = (int)(auVar39._0_4_ + auVar34._0_4_);
                auVar96._4_4_ = (int)(auVar39._4_4_ + auVar34._4_4_);
                auVar96._8_4_ = (int)(auVar39._8_4_ + auVar34._8_4_);
                auVar96._12_4_ = (int)(auVar39._12_4_ + auVar34._12_4_);
                auVar96._16_4_ = (int)(auVar39._16_4_ + auVar34._16_4_);
                auVar96._20_4_ = (int)(auVar39._20_4_ + auVar34._20_4_);
                auVar96._24_4_ = (int)(auVar39._24_4_ + auVar34._24_4_);
                auVar96._28_4_ = (int)(in_ZMM10._28_4_ + auVar34._28_4_);
                auVar33 = vpackssdw_avx2(auVar84,auVar96);
                auVar33 = vpermq_avx2(auVar33,0xd8);
                auVar33 = vpminsw_avx2(auVar33,auVar53);
                auVar33 = vpmaxsw_avx2(auVar33,auVar57);
                in_ZMM10 = ZEXT1664(auVar33._16_16_);
                auVar28 = vpacksswb_avx(auVar33._0_16_,auVar33._16_16_);
                auVar28 = vpshufb_avx(auVar28,auVar46);
                in_ZMM9 = ZEXT1664(auVar28);
                *pauVar8 = auVar28;
                pauVar8 = pauVar8 + 1;
                pfVar24 = pfVar24 + 8;
                iVar15 = iVar15 + 2;
                uVar10 = uVar26;
              } while (iVar15 < max_kk);
            }
            iVar15 = max_kk - uVar10;
            if (iVar15 != 0 && (int)uVar10 <= max_kk) {
              do {
                auVar2._4_4_ = pfVar24[1] * scale;
                auVar2._0_4_ = *pfVar24 * scale;
                auVar2._8_4_ = pfVar24[2] * scale;
                auVar2._12_4_ = pfVar24[3] * scale;
                auVar2._16_4_ = pfVar24[lVar22 + 4] * scale;
                auVar2._20_4_ = pfVar24[lVar22 + 5] * scale;
                auVar2._24_4_ = pfVar24[lVar22 + 6] * scale;
                auVar2._28_4_ = pfVar24[lVar22 + 7];
                auVar33 = vpternlogd_avx512vl(auVar49,auVar2,auVar45,0xf8);
                in_ZMM10 = ZEXT3264(auVar33);
                auVar85._0_4_ = (int)(*pfVar24 * scale + auVar33._0_4_);
                auVar85._4_4_ = (int)(pfVar24[1] * scale + auVar33._4_4_);
                auVar85._8_4_ = (int)(pfVar24[2] * scale + auVar33._8_4_);
                auVar85._12_4_ = (int)(pfVar24[3] * scale + auVar33._12_4_);
                auVar85._16_4_ = (int)(pfVar24[lVar22 + 4] * scale + auVar33._16_4_);
                auVar85._20_4_ = (int)(pfVar24[lVar22 + 5] * scale + auVar33._20_4_);
                auVar85._24_4_ = (int)(pfVar24[lVar22 + 6] * scale + auVar33._24_4_);
                auVar85._28_4_ = (int)(pfVar24[lVar22 + 7] + auVar33._28_4_);
                auVar28 = vpmovsdb_avx512vl(auVar85);
                auVar82._8_8_ = 0;
                auVar82._0_8_ = auVar28._0_8_;
                auVar28 = vpmaxsb_avx(auVar82,auVar29);
                in_ZMM9 = ZEXT1664(auVar28);
                *(long *)*pauVar8 = auVar28._0_8_;
                pauVar8 = (undefined1 (*) [16])(*pauVar8 + 8);
                pfVar24 = pfVar24 + 4;
                iVar15 = iVar15 + -1;
              } while (iVar15 != 0);
            }
          }
          if (iVar6 == 1) {
            uVar10 = 0;
            if (1 < max_kk) {
              iVar15 = 1;
              do {
                auVar33 = vpcmpeqd_avx2(in_ZMM10._0_32_,in_ZMM10._0_32_);
                auVar86 = vgatherdps(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar33);
                auVar33 = vpcmpeqd_avx2(in_ZMM11._0_32_,in_ZMM11._0_32_);
                auVar97 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar33);
                fVar81 = auVar86._0_4_ * scale;
                fVar89 = auVar86._4_4_ * scale;
                auVar3._4_4_ = fVar89;
                auVar3._0_4_ = fVar81;
                fVar90 = auVar86._8_4_ * scale;
                auVar3._8_4_ = fVar90;
                fVar91 = auVar86._12_4_ * scale;
                auVar3._12_4_ = fVar91;
                fVar92 = auVar86._16_4_ * scale;
                auVar3._16_4_ = fVar92;
                fVar93 = auVar86._20_4_ * scale;
                auVar3._20_4_ = fVar93;
                fVar94 = auVar86._24_4_ * scale;
                auVar3._24_4_ = fVar94;
                auVar3._28_4_ = auVar86._28_4_;
                fVar95 = auVar97._0_4_ * scale;
                fVar99 = auVar97._4_4_ * scale;
                auVar4._4_4_ = fVar99;
                auVar4._0_4_ = fVar95;
                fVar100 = auVar97._8_4_ * scale;
                auVar4._8_4_ = fVar100;
                fVar101 = auVar97._12_4_ * scale;
                auVar4._12_4_ = fVar101;
                fVar102 = auVar97._16_4_ * scale;
                auVar4._16_4_ = fVar102;
                fVar103 = auVar97._20_4_ * scale;
                auVar4._20_4_ = fVar103;
                fVar104 = auVar97._24_4_ * scale;
                auVar4._24_4_ = fVar104;
                auVar4._28_4_ = auVar97._28_4_;
                auVar33 = vpternlogd_avx512vl(auVar49,auVar3,auVar45,0xf8);
                in_ZMM11 = ZEXT3264(auVar33);
                auVar34 = vpternlogd_avx512vl(auVar49,auVar4,auVar45,0xf8);
                auVar87._0_4_ = (int)(fVar81 + auVar33._0_4_);
                auVar87._4_4_ = (int)(fVar89 + auVar33._4_4_);
                auVar87._8_4_ = (int)(fVar90 + auVar33._8_4_);
                auVar87._12_4_ = (int)(fVar91 + auVar33._12_4_);
                auVar87._16_4_ = (int)(fVar92 + auVar33._16_4_);
                auVar87._20_4_ = (int)(fVar93 + auVar33._20_4_);
                auVar87._24_4_ = (int)(fVar94 + auVar33._24_4_);
                auVar87._28_4_ = (int)(auVar86._28_4_ + auVar33._28_4_);
                auVar98._0_4_ = (int)(fVar95 + auVar34._0_4_);
                auVar98._4_4_ = (int)(fVar99 + auVar34._4_4_);
                auVar98._8_4_ = (int)(fVar100 + auVar34._8_4_);
                auVar98._12_4_ = (int)(fVar101 + auVar34._12_4_);
                auVar98._16_4_ = (int)(fVar102 + auVar34._16_4_);
                auVar98._20_4_ = (int)(fVar103 + auVar34._20_4_);
                auVar98._24_4_ = (int)(fVar104 + auVar34._24_4_);
                auVar98._28_4_ = (int)(auVar97._28_4_ + auVar34._28_4_);
                auVar33 = vpackssdw_avx2(auVar87,auVar98);
                auVar33 = vpermq_avx2(auVar33,0xd8);
                auVar33 = vpminsw_avx2(auVar33,auVar53);
                auVar33 = vpmaxsw_avx2(auVar33,auVar57);
                in_ZMM10 = ZEXT1664(auVar33._16_16_);
                auVar28 = vpacksswb_avx(auVar33._0_16_,auVar33._16_16_);
                auVar28 = vpshufb_avx(auVar28,auVar30);
                in_ZMM9 = ZEXT1664(auVar28);
                *pauVar8 = auVar28;
                pauVar8 = pauVar8 + 1;
                iVar15 = iVar15 + 2;
                uVar10 = uVar26;
              } while (iVar15 < max_kk);
            }
            iVar15 = max_kk - uVar10;
            if (iVar15 != 0 && (int)uVar10 <= max_kk) {
              do {
                auVar33 = vpcmpeqd_avx2(in_ZMM10._0_32_,in_ZMM10._0_32_);
                auVar34 = vgatherdps(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar33);
                fVar81 = auVar34._0_4_ * scale;
                fVar89 = auVar34._4_4_ * scale;
                auVar5._4_4_ = fVar89;
                auVar5._0_4_ = fVar81;
                fVar90 = auVar34._8_4_ * scale;
                auVar5._8_4_ = fVar90;
                fVar91 = auVar34._12_4_ * scale;
                auVar5._12_4_ = fVar91;
                fVar92 = auVar34._16_4_ * scale;
                auVar5._16_4_ = fVar92;
                fVar93 = auVar34._20_4_ * scale;
                auVar5._20_4_ = fVar93;
                fVar94 = auVar34._24_4_ * scale;
                auVar5._24_4_ = fVar94;
                auVar5._28_4_ = auVar34._28_4_;
                auVar33 = vpternlogd_avx512vl(auVar49,auVar5,auVar45,0xf8);
                in_ZMM10 = ZEXT3264(auVar33);
                auVar88._0_4_ = (int)(fVar81 + auVar33._0_4_);
                auVar88._4_4_ = (int)(fVar89 + auVar33._4_4_);
                auVar88._8_4_ = (int)(fVar90 + auVar33._8_4_);
                auVar88._12_4_ = (int)(fVar91 + auVar33._12_4_);
                auVar88._16_4_ = (int)(fVar92 + auVar33._16_4_);
                auVar88._20_4_ = (int)(fVar93 + auVar33._20_4_);
                auVar88._24_4_ = (int)(fVar94 + auVar33._24_4_);
                auVar88._28_4_ = (int)(auVar34._28_4_ + auVar33._28_4_);
                auVar28 = vpmovsdb_avx512vl(auVar88);
                auVar83._8_8_ = 0;
                auVar83._0_8_ = auVar28._0_8_;
                auVar28 = vpmaxsb_avx(auVar83,auVar29);
                in_ZMM9 = ZEXT1664(auVar28);
                *(long *)*pauVar8 = auVar28._0_8_;
                pauVar8 = (undefined1 (*) [16])(*pauVar8 + 8);
                iVar15 = iVar15 + -1;
              } while (iVar15 != 0);
            }
          }
          uVar16 = uVar18 + 8;
          lVar25 = uVar18 + 0xf;
          uVar18 = uVar16;
        } while (lVar25 < lVar21);
      }
      if ((int)((uint)uVar16 | 3) < max_jj) {
        pvVar12 = B->data;
        auVar30 = vpbroadcastd_avx512vl();
        vpmulld_avx(auVar30,_DAT_005a6910);
        auVar30._8_4_ = 0x80000000;
        auVar30._0_8_ = 0x8000000080000000;
        auVar30._12_4_ = 0x80000000;
        auVar46._8_4_ = 0x3f000000;
        auVar46._0_8_ = 0x3f0000003f000000;
        auVar46._12_4_ = 0x3f000000;
        auVar50._8_2_ = 0x7f;
        auVar50._0_8_ = 0x7f007f007f007f;
        auVar50._10_2_ = 0x7f;
        auVar50._12_2_ = 0x7f;
        auVar50._14_2_ = 0x7f;
        auVar54._8_2_ = 0xff81;
        auVar54._0_8_ = 0xff81ff81ff81ff81;
        auVar54._10_2_ = 0xff81;
        auVar54._12_2_ = 0xff81;
        auVar54._14_2_ = 0xff81;
        uVar18 = uVar16 & 0xffffffff;
        do {
          pfVar24 = (float *)((long)pvVar12 + (lVar19 + uVar18) * lVar14 * 4 + (long)(iVar6 * k) * 4
                             );
          if (iVar6 == 4) {
            uVar26 = 0;
            if (1 < max_kk) {
              iVar15 = 1;
              do {
                auVar58._0_4_ = scale * *pfVar24;
                auVar58._4_4_ = scale * pfVar24[1];
                auVar58._8_4_ = scale * pfVar24[2];
                auVar58._12_4_ = scale * pfVar24[3];
                auVar69._0_4_ = scale * pfVar24[4];
                auVar69._4_4_ = scale * pfVar24[5];
                auVar69._8_4_ = scale * pfVar24[6];
                auVar69._12_4_ = scale * pfVar24[7];
                auVar32 = vunpcklps_avx(auVar58,auVar69);
                auVar28 = vunpckhps_avx(auVar58,auVar69);
                auVar29 = vpternlogd_avx512vl(auVar46,auVar32,auVar30,0xf8);
                auVar31 = vpternlogd_avx512vl(auVar46,auVar28,auVar30,0xf8);
                auVar70._0_4_ = (int)(auVar32._0_4_ + auVar29._0_4_);
                auVar70._4_4_ = (int)(auVar32._4_4_ + auVar29._4_4_);
                auVar70._8_4_ = (int)(auVar32._8_4_ + auVar29._8_4_);
                auVar70._12_4_ = (int)(auVar32._12_4_ + auVar29._12_4_);
                auVar59._0_4_ = (int)(auVar31._0_4_ + auVar28._0_4_);
                auVar59._4_4_ = (int)(auVar31._4_4_ + auVar28._4_4_);
                auVar59._8_4_ = (int)(auVar31._8_4_ + auVar28._8_4_);
                auVar59._12_4_ = (int)(auVar31._12_4_ + auVar28._12_4_);
                auVar28 = vpackssdw_avx(auVar70,auVar59);
                auVar28 = vpminsw_avx(auVar28,auVar50);
                auVar28 = vpmaxsw_avx(auVar28,auVar54);
                auVar28 = vpacksswb_avx(auVar28,auVar28);
                in_ZMM6 = ZEXT1664(auVar28);
                *(long *)*pauVar8 = auVar28._0_8_;
                pauVar8 = (undefined1 (*) [16])(*pauVar8 + 8);
                pfVar24 = pfVar24 + 8;
                iVar15 = iVar15 + 2;
                uVar26 = max_kk & 0xfffffffeU;
              } while (iVar15 < max_kk);
            }
            iVar15 = max_kk - uVar26;
            if (iVar15 != 0 && (int)uVar26 <= max_kk) {
              do {
                auVar60._0_4_ = scale * *pfVar24;
                auVar60._4_4_ = scale * pfVar24[1];
                auVar60._8_4_ = scale * pfVar24[2];
                auVar60._12_4_ = scale * pfVar24[3];
                auVar28 = vpternlogd_avx512vl(auVar46,auVar60,auVar30,0xf8);
                auVar61._0_4_ = (int)(auVar60._0_4_ + auVar28._0_4_);
                auVar61._4_4_ = (int)(auVar60._4_4_ + auVar28._4_4_);
                auVar61._8_4_ = (int)(auVar60._8_4_ + auVar28._8_4_);
                auVar61._12_4_ = (int)(auVar60._12_4_ + auVar28._12_4_);
                auVar28 = vpackssdw_avx(auVar61,auVar61);
                auVar28 = vpminsw_avx(auVar28,auVar50);
                auVar28 = vpmaxsw_avx(auVar28,auVar54);
                auVar28 = vpacksswb_avx(auVar28,auVar28);
                in_ZMM6 = ZEXT1664(auVar28);
                *(int *)*pauVar8 = auVar28._0_4_;
                pauVar8 = (undefined1 (*) [16])(*pauVar8 + 4);
                pfVar24 = pfVar24 + 4;
                iVar15 = iVar15 + -1;
              } while (iVar15 != 0);
            }
          }
          if (iVar6 == 1) {
            uVar26 = 0;
            if (1 < max_kk) {
              iVar15 = 1;
              do {
                auVar28 = vpcmpeqd_avx(in_ZMM6._0_16_,in_ZMM6._0_16_);
                auVar29 = vgatherdps(ZEXT816(0) << 0x40,auVar28);
                auVar28 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
                auVar28 = vgatherdps(ZEXT816(0) << 0x40,auVar28);
                auVar32 = vunpcklps_avx(auVar29,auVar28);
                auVar28 = vunpckhps_avx(auVar29,auVar28);
                auVar62._0_4_ = auVar32._0_4_ * scale;
                auVar62._4_4_ = auVar32._4_4_ * scale;
                auVar62._8_4_ = auVar32._8_4_ * scale;
                auVar62._12_4_ = auVar32._12_4_ * scale;
                auVar71._0_4_ = auVar28._0_4_ * scale;
                auVar71._4_4_ = auVar28._4_4_ * scale;
                auVar71._8_4_ = auVar28._8_4_ * scale;
                auVar71._12_4_ = auVar28._12_4_ * scale;
                auVar28 = vpternlogd_avx512vl(auVar46,auVar62,auVar30,0xf8);
                auVar32 = vpternlogd_avx512vl(auVar46,auVar71,auVar30,0xf8);
                auVar63._0_4_ = (int)(auVar28._0_4_ + auVar62._0_4_);
                auVar63._4_4_ = (int)(auVar28._4_4_ + auVar62._4_4_);
                auVar63._8_4_ = (int)(auVar28._8_4_ + auVar62._8_4_);
                auVar63._12_4_ = (int)(auVar28._12_4_ + auVar62._12_4_);
                auVar72._0_4_ = (int)(auVar32._0_4_ + auVar71._0_4_);
                auVar72._4_4_ = (int)(auVar32._4_4_ + auVar71._4_4_);
                auVar72._8_4_ = (int)(auVar32._8_4_ + auVar71._8_4_);
                auVar72._12_4_ = (int)(auVar32._12_4_ + auVar71._12_4_);
                auVar28 = vpackssdw_avx(auVar63,auVar72);
                auVar28 = vpminsw_avx(auVar28,auVar50);
                auVar28 = vpmaxsw_avx(auVar28,auVar54);
                auVar28 = vpacksswb_avx(auVar28,auVar28);
                in_ZMM6 = ZEXT1664(auVar28);
                *(long *)*pauVar8 = auVar28._0_8_;
                pauVar8 = (undefined1 (*) [16])(*pauVar8 + 8);
                iVar15 = iVar15 + 2;
                uVar26 = max_kk & 0xfffffffeU;
              } while (iVar15 < max_kk);
            }
            iVar15 = max_kk - uVar26;
            if (iVar15 != 0 && (int)uVar26 <= max_kk) {
              do {
                auVar28 = vpcmpeqd_avx(in_ZMM6._0_16_,in_ZMM6._0_16_);
                auVar28 = vgatherdps((undefined1  [16])0x0,auVar28);
                auVar64._0_4_ = auVar28._0_4_ * scale;
                auVar64._4_4_ = auVar28._4_4_ * scale;
                auVar64._8_4_ = auVar28._8_4_ * scale;
                auVar64._12_4_ = auVar28._12_4_ * scale;
                auVar28 = vpternlogd_avx512vl(auVar46,auVar64,auVar30,0xf8);
                auVar65._0_4_ = (int)(auVar64._0_4_ + auVar28._0_4_);
                auVar65._4_4_ = (int)(auVar64._4_4_ + auVar28._4_4_);
                auVar65._8_4_ = (int)(auVar64._8_4_ + auVar28._8_4_);
                auVar65._12_4_ = (int)(auVar64._12_4_ + auVar28._12_4_);
                auVar28 = vpackssdw_avx(auVar65,auVar65);
                auVar28 = vpminsw_avx(auVar28,auVar50);
                auVar28 = vpmaxsw_avx(auVar28,auVar54);
                auVar28 = vpacksswb_avx(auVar28,auVar28);
                in_ZMM6 = ZEXT1664(auVar28);
                *(int *)*pauVar8 = auVar28._0_4_;
                pauVar8 = (undefined1 (*) [16])(*pauVar8 + 4);
                iVar15 = iVar15 + -1;
              } while (iVar15 != 0);
            }
          }
          uVar16 = uVar18 + 4;
          lVar22 = uVar18 + 7;
          uVar18 = uVar16;
        } while (lVar22 < lVar21);
      }
      uVar26 = (uint)uVar16;
      lVar22 = (long)k;
      if ((int)(uVar26 | 1) < max_jj) {
        lVar25 = (int)uVar26 + lVar19;
        lVar23 = (lVar25 * 4 + 4) * lVar14 + lVar22 * 4;
        lVar25 = lVar22 * 4 + lVar25 * lVar14 * 4;
        auVar41._8_4_ = 0x80000000;
        auVar41._0_8_ = 0x8000000080000000;
        auVar41._12_4_ = 0x80000000;
        auVar43._8_4_ = 0x3f000000;
        auVar43._0_8_ = 0x3f0000003f000000;
        auVar43._12_4_ = 0x3f000000;
        auVar47._8_2_ = 0x7f;
        auVar47._0_8_ = 0x7f007f007f007f;
        auVar47._10_2_ = 0x7f;
        auVar47._12_2_ = 0x7f;
        auVar47._14_2_ = 0x7f;
        auVar51._8_2_ = 0xff81;
        auVar51._0_8_ = 0xff81ff81ff81ff81;
        auVar51._10_2_ = 0xff81;
        auVar51._12_2_ = 0xff81;
        auVar51._14_2_ = 0xff81;
        auVar55._8_4_ = 0x80000000;
        auVar55._0_8_ = 0x8000000080000000;
        auVar55._12_4_ = 0x80000000;
        auVar66._8_4_ = 0x3effffff;
        auVar66._0_8_ = 0x3effffff3effffff;
        auVar66._12_4_ = 0x3effffff;
        uVar18 = (long)(int)uVar26;
        do {
          pvVar12 = B->data;
          puVar27 = (ulong *)((long)pvVar12 + lVar22 * 4 + (uVar18 + lVar19) * lVar14 * 4);
          if (max_kk < 4) {
            uVar26 = 0;
          }
          else {
            iVar6 = 3;
            lVar13 = 0;
            do {
              pfVar24 = (float *)((long)pvVar12 + lVar13 * 2 + lVar25);
              auVar73._0_4_ = scale * *pfVar24;
              auVar73._4_4_ = scale * pfVar24[1];
              auVar73._8_4_ = scale * pfVar24[2];
              auVar73._12_4_ = scale * pfVar24[3];
              pfVar24 = (float *)((long)pvVar12 + lVar13 * 2 + lVar23);
              auVar78._0_4_ = scale * *pfVar24;
              auVar78._4_4_ = scale * pfVar24[1];
              auVar78._8_4_ = scale * pfVar24[2];
              auVar78._12_4_ = scale * pfVar24[3];
              auVar30 = vmovlhps_avx(auVar73,auVar78);
              auVar46 = vunpckhpd_avx(auVar73,auVar78);
              auVar28 = vpternlogd_avx512vl(auVar43,auVar30,auVar41,0xf8);
              auVar32 = vpternlogd_avx512vl(auVar43,auVar46,auVar41,0xf8);
              auVar79._0_4_ = (int)(auVar30._0_4_ + auVar28._0_4_);
              auVar79._4_4_ = (int)(auVar30._4_4_ + auVar28._4_4_);
              auVar79._8_4_ = (int)(auVar30._8_4_ + auVar28._8_4_);
              auVar79._12_4_ = (int)(auVar30._12_4_ + auVar28._12_4_);
              auVar74._0_4_ = (int)(auVar32._0_4_ + auVar46._0_4_);
              auVar74._4_4_ = (int)(auVar32._4_4_ + auVar46._4_4_);
              auVar74._8_4_ = (int)(auVar32._8_4_ + auVar46._8_4_);
              auVar74._12_4_ = (int)(auVar32._12_4_ + auVar46._12_4_);
              auVar30 = vpackssdw_avx(auVar79,auVar74);
              auVar30 = vpminsw_avx(auVar30,auVar47);
              auVar30 = vpmaxsw_avx(auVar30,auVar51);
              auVar30 = vpacksswb_avx(auVar30,auVar30);
              *(long *)(*pauVar8 + lVar13) = auVar30._0_8_;
              puVar27 = puVar27 + 2;
              lVar13 = lVar13 + 8;
              iVar6 = iVar6 + 4;
            } while (iVar6 < max_kk);
            pauVar8 = (undefined1 (*) [16])(*pauVar8 + lVar13);
            uVar26 = max_kk & 0xfffffffc;
          }
          uVar10 = uVar26 | 1;
          while ((int)uVar10 < max_kk) {
            auVar75._8_8_ = 0;
            auVar75._0_8_ = *(ulong *)((long)puVar27 + lVar14 * 4);
            auVar80._8_8_ = 0;
            auVar80._0_8_ = *puVar27;
            auVar30 = vmovlhps_avx(auVar80,auVar75);
            auVar76._0_4_ = scale * auVar30._0_4_;
            auVar76._4_4_ = scale * auVar30._4_4_;
            auVar76._8_4_ = scale * auVar30._8_4_;
            auVar76._12_4_ = scale * auVar30._12_4_;
            auVar30 = vpternlogd_avx512vl(auVar43,auVar76,auVar41,0xf8);
            auVar77._0_4_ = (int)(auVar30._0_4_ + auVar76._0_4_);
            auVar77._4_4_ = (int)(auVar30._4_4_ + auVar76._4_4_);
            auVar77._8_4_ = (int)(auVar30._8_4_ + auVar76._8_4_);
            auVar77._12_4_ = (int)(auVar30._12_4_ + auVar76._12_4_);
            auVar30 = vpackssdw_avx(auVar77,auVar77);
            auVar30 = vpminsw_avx(auVar30,auVar47);
            auVar30 = vpmaxsw_avx(auVar30,auVar51);
            auVar30 = vpacksswb_avx(auVar30,auVar30);
            *(int *)*pauVar8 = auVar30._0_4_;
            pauVar8 = (undefined1 (*) [16])(*pauVar8 + 4);
            puVar27 = puVar27 + 1;
            uVar10 = uVar26 + 3;
            uVar26 = uVar26 + 2;
          }
          if ((int)uVar26 < max_kk) {
            lVar13 = 0;
            do {
              fVar81 = scale * *(float *)((long)puVar27 + lVar13 * 4);
              auVar30 = vpternlogd_avx512vl(auVar66,ZEXT416((uint)fVar81),auVar55,0xf8);
              auVar30 = ZEXT416((uint)(auVar30._0_4_ + fVar81));
              auVar30 = vroundss_avx(auVar30,auVar30,0xb);
              iVar6 = (int)auVar30._0_4_;
              if (iVar6 < -0x7e) {
                iVar6 = -0x7f;
              }
              if (0x7e < iVar6) {
                iVar6 = 0x7f;
              }
              (*pauVar8)[0] = (char)iVar6;
              fVar81 = scale * *(float *)((long)puVar27 + lVar13 * 4 + lVar14 * 4);
              auVar30 = vpternlogd_avx512vl(auVar66,ZEXT416((uint)fVar81),auVar55,0xf8);
              auVar30 = ZEXT416((uint)(auVar30._0_4_ + fVar81));
              auVar30 = vroundss_avx(auVar30,auVar30,0xb);
              iVar6 = (int)auVar30._0_4_;
              if (iVar6 < -0x7e) {
                iVar6 = -0x7f;
              }
              if (0x7e < iVar6) {
                iVar6 = 0x7f;
              }
              (*pauVar8)[1] = (char)iVar6;
              pauVar8 = (undefined1 (*) [16])(*pauVar8 + 2);
              lVar13 = lVar13 + 1;
            } while (max_kk - uVar26 != (int)lVar13);
          }
          uVar16 = uVar18 + 2;
          lVar13 = uVar18 + 3;
          lVar23 = lVar23 + lVar14 * 8;
          lVar25 = lVar25 + lVar14 * 8;
          uVar18 = uVar16;
        } while (lVar13 < lVar21);
      }
      if ((int)uVar16 < max_jj) {
        lVar25 = (long)(int)uVar16;
        auVar42._8_4_ = 0x3f000000;
        auVar42._0_8_ = 0x3f0000003f000000;
        auVar42._12_4_ = 0x3f000000;
        auVar44._8_4_ = 0x80000000;
        auVar44._0_8_ = 0x8000000080000000;
        auVar44._12_4_ = 0x80000000;
        auVar48._8_2_ = 0x7f;
        auVar48._0_8_ = 0x7f007f007f007f;
        auVar48._10_2_ = 0x7f;
        auVar48._12_2_ = 0x7f;
        auVar48._14_2_ = 0x7f;
        auVar52._8_2_ = 0xff81;
        auVar52._0_8_ = 0xff81ff81ff81ff81;
        auVar52._10_2_ = 0xff81;
        auVar52._12_2_ = 0xff81;
        auVar52._14_2_ = 0xff81;
        auVar56._8_4_ = 0x3effffff;
        auVar56._0_8_ = 0x3effffff3effffff;
        auVar56._12_4_ = 0x3effffff;
        do {
          pfVar24 = (float *)((long)B->data + lVar22 * 4 + (lVar25 + lVar19) * lVar14 * 4);
          if (max_kk < 4) {
            uVar26 = 0;
          }
          else {
            iVar6 = 3;
            do {
              auVar67._0_4_ = scale * *pfVar24;
              auVar67._4_4_ = scale * pfVar24[1];
              auVar67._8_4_ = scale * pfVar24[2];
              auVar67._12_4_ = scale * pfVar24[3];
              auVar30 = vpternlogd_avx512vl(auVar42,auVar67,auVar44,0xf8);
              auVar68._0_4_ = (int)(auVar67._0_4_ + auVar30._0_4_);
              auVar68._4_4_ = (int)(auVar67._4_4_ + auVar30._4_4_);
              auVar68._8_4_ = (int)(auVar67._8_4_ + auVar30._8_4_);
              auVar68._12_4_ = (int)(auVar67._12_4_ + auVar30._12_4_);
              auVar30 = vpackssdw_avx(auVar68,auVar68);
              auVar30 = vpminsw_avx(auVar30,auVar48);
              auVar30 = vpmaxsw_avx(auVar30,auVar52);
              auVar30 = vpacksswb_avx(auVar30,auVar30);
              *(int *)*pauVar8 = auVar30._0_4_;
              pauVar8 = (undefined1 (*) [16])(*pauVar8 + 4);
              pfVar24 = pfVar24 + 4;
              iVar6 = iVar6 + 4;
              uVar26 = max_kk & 0xfffffffc;
            } while (iVar6 < max_kk);
          }
          if ((int)uVar26 < max_kk) {
            lVar23 = 0;
            do {
              auVar30 = vpternlogd_avx512vl(auVar56,ZEXT416((uint)(scale * pfVar24[lVar23])),auVar44
                                            ,0xf8);
              auVar30 = ZEXT416((uint)(scale * pfVar24[lVar23] + auVar30._0_4_));
              auVar30 = vroundss_avx(auVar30,auVar30,0xb);
              iVar6 = (int)auVar30._0_4_;
              if (iVar6 < -0x7e) {
                iVar6 = -0x7f;
              }
              if (0x7e < iVar6) {
                iVar6 = 0x7f;
              }
              (*pauVar8)[lVar23] = (char)iVar6;
              lVar23 = lVar23 + 1;
            } while (max_kk - uVar26 != (int)lVar23);
            pauVar8 = (undefined1 (*) [16])(*pauVar8 + lVar23);
          }
          lVar25 = lVar25 + 1;
        } while (lVar25 != lVar21);
      }
      return;
    }
    pack_B_tile_fp32_to_int8_avxvnni(B,BT,j,max_jj,k,max_kk,scale);
    return;
  }
  pack_B_tile_fp32_to_int8_avxvnniint8(B,BT,j,max_jj,k,max_kk,scale);
  return;
}

Assistant:

static void pack_B_tile_quantize(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk, float scale)
{
    pack_B_tile_fp32_to_int8(B, BT, j, max_jj, k, max_kk, scale);
}